

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

PClassActor * ClassForSpawn(FName *classname)

{
  PClass *pPVar1;
  PClassActor *pPVar2;
  PClass *pPVar3;
  bool bVar4;
  FName local_1c;
  
  local_1c = (FName)classname->Index;
  pPVar2 = (PClassActor *)PClass::FindClass(&local_1c);
  if (pPVar2 == (PClassActor *)0x0) {
    I_Error("Attempt to spawn actor of unknown type \'%s\'\n",
            FName::NameData.NameArray[classname->Index].Text);
  }
  pPVar1 = PClassActor::RegistrationInfo.MyClass;
  pPVar3 = *(PClass **)
            ((long)&(pPVar2->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 8);
  if (pPVar3 == (PClass *)0x0) {
    pPVar3 = (PClass *)
             (*(code *)*(pPVar2->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase.super_DObject._vptr_DObject)
                       (pPVar2);
    *(PClass **)
     ((long)&(pPVar2->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
             super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 8) = pPVar3;
  }
  bVar4 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar4) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar4 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar4) {
    I_Error("Attempt to spawn non-actor of type \'%s\'\n",
            FName::NameData.NameArray[classname->Index].Text);
  }
  return pPVar2;
}

Assistant:

PClassActor *ClassForSpawn(FName classname)
{
	PClass *cls = PClass::FindClass(classname);
	if (cls == NULL)
	{
		I_Error("Attempt to spawn actor of unknown type '%s'\n", classname.GetChars());
	}
	if (!cls->IsKindOf(RUNTIME_CLASS(PClassActor)))
	{
		I_Error("Attempt to spawn non-actor of type '%s'\n", classname.GetChars());
	}
	return static_cast<PClassActor*>(cls);
}